

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

void __thiscall args::NamedBase::~NamedBase(NamedBase *this)

{
  pointer pcVar1;
  
  (this->super_Base)._vptr_Base = (_func_int **)&PTR__NamedBase_0013c8c8;
  pcVar1 = (this->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->name).field_2) {
    operator_delete(pcVar1);
  }
  (this->super_Base)._vptr_Base = (_func_int **)&PTR__Base_0013c770;
  pcVar1 = (this->super_Base).help._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_Base).help.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

virtual ~NamedBase() {}